

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallclocktimer.cpp
# Opt level: O0

time_t __thiscall soplex::WallclockTimer::time(WallclockTimer *this,time_t *__timer)

{
  Real RVar1;
  timeval tp;
  timeval local_18;
  WallclockTimer *local_8;
  
  if ((this->super_Timer).status == RUNNING) {
    local_8 = this;
    gettimeofday(&local_18,(__timezone_ptr_t)0x0);
    if (local_18.tv_usec + this->usec < 0xf4241) {
      RVar1 = wall2sec(this,this->sec + local_18.tv_sec,this->usec + local_18.tv_usec);
      this->lasttime = RVar1;
    }
    else {
      RVar1 = wall2sec(this,this->sec + local_18.tv_sec + 1,this->usec + -1000000 + local_18.tv_usec
                      );
      this->lasttime = RVar1;
    }
  }
  return (time_t)this;
}

Assistant:

Real WallclockTimer::time() const
{
#if !defined(_WIN32) && !defined(_WIN64)
   struct timeval tp; /*lint !e86*/
#endif

   // only update times if timer is still running
   if(status == RUNNING)
   {
#if defined(_WIN32) || defined(_WIN64)
      // we need the blank specifier to distiguish this method from WallclockTimer::time
      lasttime = wall2sec(sec + ::time(nullptr), 0);
#else
      gettimeofday(&tp, nullptr);

      // check whether the microseconds add up to more than a second
      if(tp.tv_usec + usec > 1000000)   /*lint !e115 !e40*/
         lasttime = wall2sec(sec + tp.tv_sec + 1, /*lint !e115 !e40*/
                             (usec - 1000000) + tp.tv_usec); /*lint !e115 !e40*/
      else
         lasttime = wall2sec(sec + tp.tv_sec, /*lint !e115 !e40*/
                             usec + tp.tv_usec); /*lint !e115 !e40*/

#endif
   }

   return lasttime;
}